

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

string * __thiscall
pbrt::ShapeSceneEntity::ToString_abi_cxx11_(string *__return_storage_ptr__,ShapeSceneEntity *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  StringPrintf<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&,pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,int_const&,std::__cxx11::string_const&,int_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ ShapeSeneEntity name: %s parameters: %s loc: %s renderFromObject: %s objectFromRender: %s reverseOrientation: %s materialIndex: %d materialName: %s lightIndex: %d insideMedium: %s outsideMedium: %s]"
             ,(char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_SceneEntity).parameters,
             (ParameterDictionary *)&(this->super_SceneEntity).loc,(FileLoc *)this->renderFromObject
             ,this->objectFromRender,(Transform *)&this->reverseOrientation,
             (bool *)&this->materialIndex,(int *)&this->materialName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->lightIndex,
             (int *)&this->insideMedium,&this->outsideMedium,in_stack_ffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf(
            "[ ShapeSeneEntity name: %s parameters: %s loc: %s "
            "renderFromObject: %s objectFromRender: %s reverseOrientation: %s "
            "materialIndex: %d materialName: %s lightIndex: %d "
            "insideMedium: %s outsideMedium: %s]",
            name, parameters, loc, *renderFromObject, *objectFromRender,
            reverseOrientation, materialIndex, materialName, lightIndex, insideMedium,
            outsideMedium);
    }